

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::InitDefaultsImpl(void)

{
  Pipeline *pPVar1;
  PipelineClassifier *pPVar2;
  PipelineRegressor *pPVar3;
  FeatureType *pFVar4;
  FeatureDescription *pFVar5;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *pMVar6;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  *default_instance;
  Metadata *pMVar7;
  ModelDescription *pMVar8;
  Model *pMVar9;
  
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/Model.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  CoreMLModels::protobuf_VisionFeaturePrint_2eproto::InitDefaults();
  CoreMLModels::protobuf_TextClassifier_2eproto::InitDefaults();
  CoreMLModels::protobuf_WordTagger_2eproto::InitDefaults();
  CoreMLModels::protobuf_Gazetteer_2eproto::InitDefaults();
  CoreMLModels::protobuf_WordEmbedding_2eproto::InitDefaults();
  protobuf_ArrayFeatureExtractor_2eproto::InitDefaults();
  protobuf_BayesianProbitRegressor_2eproto::InitDefaults();
  protobuf_CategoricalMapping_2eproto::InitDefaults();
  protobuf_CustomModel_2eproto::InitDefaults();
  protobuf_DictVectorizer_2eproto::InitDefaults();
  protobuf_FeatureTypes_2eproto::InitDefaults();
  protobuf_FeatureVectorizer_2eproto::InitDefaults();
  protobuf_GLMRegressor_2eproto::InitDefaults();
  protobuf_GLMClassifier_2eproto::InitDefaults();
  protobuf_NearestNeighbors_2eproto::InitDefaults();
  protobuf_Identity_2eproto::InitDefaults();
  protobuf_Imputer_2eproto::InitDefaults();
  protobuf_NeuralNetwork_2eproto::InitDefaults();
  protobuf_Normalizer_2eproto::InitDefaults();
  protobuf_OneHotEncoder_2eproto::InitDefaults();
  protobuf_Scaler_2eproto::InitDefaults();
  protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  protobuf_SVM_2eproto::InitDefaults();
  protobuf_TreeEnsemble_2eproto::InitDefaults();
  protobuf_Parameters_2eproto::InitDefaults();
  protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::InitDefaults();
  protobuf_LinkedModel_2eproto::InitDefaults();
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Pipeline>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::Pipeline> *)
                   _Pipeline_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PipelineClassifier>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::PipelineClassifier> *)
                   _PipelineClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PipelineRegressor>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::PipelineRegressor> *)
                   _PipelineRegressor_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FeatureDescription>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::FeatureDescription> *)
                   _FeatureDescription_default_instance_);
  google::protobuf::internal::
  ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
  ::DefaultConstruct((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                      *)_Metadata_UserDefinedEntry_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Metadata>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::Metadata> *)
                   _Metadata_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ModelDescription>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::ModelDescription> *)
                   _ModelDescription_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SerializedModel>::
  DefaultConstruct((ExplicitlyConstructed<CoreML::Specification::SerializedModel> *)
                   _SerializedModel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Model>::DefaultConstruct
            ((ExplicitlyConstructed<CoreML::Specification::Model> *)_Model_default_instance_);
  pPVar1 = Pipeline::internal_default_instance();
  pPVar2 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::PipelineClassifier>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::PipelineClassifier> *)
                      _PipelineClassifier_default_instance_);
  pPVar2->pipeline_ = pPVar1;
  pPVar1 = Pipeline::internal_default_instance();
  pPVar3 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::PipelineRegressor>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::PipelineRegressor> *)
                      _PipelineRegressor_default_instance_);
  pPVar3->pipeline_ = pPVar1;
  pFVar4 = FeatureType::internal_default_instance();
  pFVar5 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::FeatureDescription>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::FeatureDescription> *)
                      _FeatureDescription_default_instance_);
  pFVar5->type_ = pFVar4;
  pMVar6 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                           *)_Metadata_UserDefinedEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  ;
  default_instance =
       &google::protobuf::internal::
        ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
        ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                       *)_Metadata_UserDefinedEntry_default_instance_)->
        super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  ::set_default_instance(pMVar6,default_instance);
  pMVar6 = &google::protobuf::internal::
            ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
            ::get_mutable((ExplicitlyConstructed<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>_>
                           *)_Metadata_UserDefinedEntry_default_instance_)->
            super_MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  ;
  google::protobuf::internal::
  MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9,_0>
  ::InitAsDefaultInstance(pMVar6);
  pMVar7 = Metadata::internal_default_instance();
  pMVar8 = google::protobuf::internal::
           ExplicitlyConstructed<CoreML::Specification::ModelDescription>::get_mutable
                     ((ExplicitlyConstructed<CoreML::Specification::ModelDescription> *)
                      _ModelDescription_default_instance_);
  pMVar8->metadata_ = pMVar7;
  pMVar8 = ModelDescription::internal_default_instance();
  pMVar9 = google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Model>::
           get_mutable((ExplicitlyConstructed<CoreML::Specification::Model> *)
                       _Model_default_instance_);
  pMVar9->description_ = pMVar8;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_VisionFeaturePrint_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_TextClassifier_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_WordTagger_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_Gazetteer_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_WordEmbedding_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_ArrayFeatureExtractor_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_BayesianProbitRegressor_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_CategoricalMapping_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_CustomModel_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_DictVectorizer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_FeatureTypes_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_FeatureVectorizer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_GLMRegressor_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_GLMClassifier_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_NearestNeighbors_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Identity_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Imputer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_NeuralNetwork_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Normalizer_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_OneHotEncoder_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Scaler_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_SVM_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_TreeEnsemble_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_Parameters_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_ItemSimilarityRecommender_2eproto::InitDefaults();
  ::CoreML::Specification::CoreMLModels::protobuf_SoundAnalysisPreprocessing_2eproto::InitDefaults();
  ::CoreML::Specification::protobuf_LinkedModel_2eproto::InitDefaults();
  _Pipeline_default_instance_.DefaultConstruct();
  _PipelineClassifier_default_instance_.DefaultConstruct();
  _PipelineRegressor_default_instance_.DefaultConstruct();
  _FeatureDescription_default_instance_.DefaultConstruct();
  _Metadata_UserDefinedEntry_default_instance_.DefaultConstruct();
  _Metadata_default_instance_.DefaultConstruct();
  _ModelDescription_default_instance_.DefaultConstruct();
  _SerializedModel_default_instance_.DefaultConstruct();
  _Model_default_instance_.DefaultConstruct();
  _PipelineClassifier_default_instance_.get_mutable()->pipeline_ = const_cast< ::CoreML::Specification::Pipeline*>(
      ::CoreML::Specification::Pipeline::internal_default_instance());
  _PipelineRegressor_default_instance_.get_mutable()->pipeline_ = const_cast< ::CoreML::Specification::Pipeline*>(
      ::CoreML::Specification::Pipeline::internal_default_instance());
  _FeatureDescription_default_instance_.get_mutable()->type_ = const_cast< ::CoreML::Specification::FeatureType*>(
      ::CoreML::Specification::FeatureType::internal_default_instance());
  _Metadata_UserDefinedEntry_default_instance_.get_mutable()->set_default_instance(_Metadata_UserDefinedEntry_default_instance_.get_mutable());
  _Metadata_UserDefinedEntry_default_instance_.get_mutable()->InitAsDefaultInstance();
  _ModelDescription_default_instance_.get_mutable()->metadata_ = const_cast< ::CoreML::Specification::Metadata*>(
      ::CoreML::Specification::Metadata::internal_default_instance());
  _Model_default_instance_.get_mutable()->description_ = const_cast< ::CoreML::Specification::ModelDescription*>(
      ::CoreML::Specification::ModelDescription::internal_default_instance());
}